

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseBuilder::align(BaseBuilder *this,AlignMode alignMode,uint32_t alignment)

{
  Error EVar1;
  AlignNode *in_RAX;
  AlignNode *node;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar1 = 5;
  }
  else {
    node = in_RAX;
    EVar1 = newAlignNode(this,&node,alignMode,alignment);
    if (EVar1 == 0) {
      addNode(this,(BaseNode *)node);
    }
  }
  return EVar1;
}

Assistant:

Error BaseBuilder::align(AlignMode alignMode, uint32_t alignment) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  AlignNode* node;
  ASMJIT_PROPAGATE(newAlignNode(&node, alignMode, alignment));
  ASMJIT_ASSUME(node != nullptr);

  addNode(node);
  return kErrorOk;
}